

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall Json::PathArgument::PathArgument(PathArgument *this,PathArgument *param_1)

{
  Kind KVar1;
  PathArgument *param_1_local;
  PathArgument *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  KVar1 = param_1->kind_;
  this->index_ = param_1->index_;
  this->kind_ = KVar1;
  return;
}

Assistant:

class JSON_API PathArgument {
public:
  friend class Path;

  PathArgument();
  PathArgument(ArrayIndex index);
  PathArgument(const char* key);
  PathArgument(String key);

private:
  enum Kind { kindNone = 0, kindIndex, kindKey };
  String key_;
  ArrayIndex index_{};
  Kind kind_{kindNone};
}